

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O3

Node * __thiscall
Lexical::identifierProgram
          (Node *__return_storage_ptr__,Lexical *this,int *nowProcedure,int *checkTable,
          int *checkKind)

{
  int *fr_;
  pointer *ppiVar1;
  int iVar2;
  ulong uVar3;
  pointer pWVar4;
  int beginIndex;
  int local_3c;
  int local_38 [2];
  
  Generator::pushIndex(&this->generator);
  local_3c = this->wordIndex;
  uVar3 = (long)local_3c + 1;
  this->wordIndex = (int)uVar3;
  pWVar4 = (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pWVar4[uVar3].symbol == (this->parsing).identifierBase) {
    fr_ = &this->wordIndex;
    pWVar4 = pWVar4 + uVar3;
    if (*checkTable != 2) {
      if (*checkTable == 1) {
        if (*checkKind == 1) {
          local_38[0] = 0;
          iVar2 = findDescription(this,&pWVar4->token,nowProcedure,local_38);
          if (iVar2 == -1) {
            local_38[1] = 1;
            iVar2 = findDescription(this,&(this->words).
                                          super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                                          super__Vector_impl_data._M_start[this->wordIndex].token,
                                    nowProcedure,local_38 + 1);
            uVar3 = (ulong)(uint)this->wordIndex;
            if (iVar2 == -1) {
              iVar2 = 0x1f;
              goto LAB_00109b9b;
            }
          }
          else {
            uVar3 = (ulong)(uint)*fr_;
          }
        }
        else {
          local_38[0] = 2;
          iVar2 = findDescription(this,&pWVar4->token,nowProcedure,local_38);
          uVar3 = (ulong)(uint)this->wordIndex;
          if (iVar2 == -1) {
            iVar2 = 0x20;
            goto LAB_00109b9b;
          }
        }
      }
LAB_00109c12:
      ppiVar1 = &(this->generator).sizeStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      pWVar4 = (this->words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_38[0] = this->nodeCnt;
      this->nodeCnt = local_38[0] + 1;
      Node::Node(__return_storage_ptr__,&pWVar4[(int)uVar3].token,local_38,fr_,fr_);
      return __return_storage_ptr__;
    }
    local_38[0] = 0;
    iVar2 = Procedure::findDes((this->procedureTable).
                               super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
                               super__Vector_impl_data._M_start + *nowProcedure,&pWVar4->token,
                               local_38);
    uVar3 = (ulong)this->wordIndex;
    if (iVar2 == -1) {
      local_38[0] = 1;
      iVar2 = Procedure::findDes((this->procedureTable).
                                 super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl.
                                 super__Vector_impl_data._M_start + *nowProcedure,
                                 &(this->words).super__Vector_base<Word,_std::allocator<Word>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar3].token,local_38);
      uVar3 = (ulong)this->wordIndex;
      if (iVar2 == -1) {
        local_38[0] = 2;
        iVar2 = Procedure::findDes((this->procedureTable).
                                   super__Vector_base<Procedure,_std::allocator<Procedure>_>._M_impl
                                   .super__Vector_impl_data._M_start + *nowProcedure,
                                   &(this->words).super__Vector_base<Word,_std::allocator<Word>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar3].token,local_38);
        uVar3 = (ulong)(uint)this->wordIndex;
        if (iVar2 == -1) goto LAB_00109c12;
      }
    }
    iVar2 = 0x21;
  }
  else {
    iVar2 = 0x19;
  }
LAB_00109b9b:
  errorParsing(__return_storage_ptr__,this,&local_3c,(int)uVar3,iVar2);
  return __return_storage_ptr__;
}

Assistant:

Node identifierProgram(const int &nowProcedure, const int &checkTable=0, const int &checkKind=1) {
		generator.pushIndex();
		int beginIndex = wordIndex;

		if (words[++wordIndex].symbol == parsing.identifierBase) {
			if (checkTable == 1) {
				if (checkKind == 1) {
					if (findDescription(words[wordIndex].token, nowProcedure, 0) == -1 and
					    findDescription(words[wordIndex].token, nowProcedure, 1) == -1)
						return errorParsing(beginIndex, wordIndex, 31);
				} else {
					if (findDescription(words[wordIndex].token, nowProcedure, 2) == -1)
						return errorParsing(beginIndex, wordIndex, 32);
				}
			} else if (checkTable == 2) {
				if (checkDescription(words[wordIndex].token, nowProcedure, 0) != -1)
					return errorParsing(beginIndex, wordIndex, 33);
				if (checkDescription(words[wordIndex].token, nowProcedure, 1) != -1)
					return errorParsing(beginIndex, wordIndex, 33);
				if (checkDescription(words[wordIndex].token, nowProcedure, 2) != -1)
					return errorParsing(beginIndex, wordIndex, 33);
			}

			generator.popIndex();
			return Node(words[wordIndex].token, nodeCnt++, wordIndex, wordIndex);
		}
		return errorParsing(beginIndex, wordIndex, 25); // BASE ERROR
	}